

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

int Ssc_GiaTransferPiPattern(Gia_Man_t *pAig,Gia_Man_t *pCare,Vec_Int_t *vPivot)

{
  int nWords_00;
  int iVar1;
  word *pSim;
  word *pwVar2;
  word *pwVar3;
  bool bVar4;
  word *pSimPiAig;
  word *pSimPiCare;
  int Count;
  word *pCareMask;
  int local_38;
  int nWords;
  int w;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPivot_local;
  Gia_Man_t *pCare_local;
  Gia_Man_t *pAig_local;
  
  nWords_00 = Gia_ObjSimWords(pCare);
  pSim = Ssc_GiaGetCareMask(pCare);
  pAig_local._4_4_ = Ssc_SimCountBits(pSim,nWords_00);
  if (pAig_local._4_4_ == 0) {
    if (pSim != (word *)0x0) {
      free(pSim);
    }
    pAig_local._4_4_ = 0;
  }
  else {
    Ssc_GiaResetPiPattern(pAig,nWords_00);
    nWords = 0;
    while( true ) {
      iVar1 = Vec_IntSize(pCare->vCis);
      bVar4 = false;
      if (nWords < iVar1) {
        _w = Gia_ManCi(pCare,nWords);
        bVar4 = _w != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pwVar2 = Gia_ObjSimPi(pAig,nWords);
      pwVar3 = Gia_ObjSimObj(pCare,_w);
      for (local_38 = 0; local_38 < nWords_00; local_38 = local_38 + 1) {
        iVar1 = Vec_IntEntry(vPivot,nWords);
        if (iVar1 == 0) {
          pwVar2[local_38] = pwVar3[local_38] & pSim[local_38];
        }
        else {
          pwVar2[local_38] = pwVar3[local_38] | pSim[local_38] ^ 0xffffffffffffffff;
        }
      }
      nWords = nWords + 1;
    }
    if (pSim != (word *)0x0) {
      free(pSim);
    }
  }
  return pAig_local._4_4_;
}

Assistant:

int Ssc_GiaTransferPiPattern( Gia_Man_t * pAig, Gia_Man_t * pCare, Vec_Int_t * vPivot )
{
    extern word * Ssc_GiaGetCareMask( Gia_Man_t * p );
    Gia_Obj_t * pObj;
    int i, w, nWords = Gia_ObjSimWords( pCare );
    word * pCareMask = Ssc_GiaGetCareMask( pCare );
    int Count = Ssc_SimCountBits( pCareMask, nWords );
    word * pSimPiCare, * pSimPiAig;
    if ( Count == 0 )
    {
        ABC_FREE( pCareMask );
        return 0;
    }
    Ssc_GiaResetPiPattern( pAig, nWords );
    Gia_ManForEachCi( pCare, pObj, i )
    {
        pSimPiAig  = Gia_ObjSimPi( pAig, i );
        pSimPiCare = Gia_ObjSimObj( pCare, pObj );
        for ( w = 0; w < nWords; w++ )
            if ( Vec_IntEntry(vPivot, i) )
                pSimPiAig[w] = pSimPiCare[w] | ~pCareMask[w];
            else
                pSimPiAig[w] = pSimPiCare[w] & pCareMask[w];
    }
    ABC_FREE( pCareMask );
    return Count;
}